

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::response::content_md5(response *this,string *s)

{
  string *in_RDI;
  response *this_00;
  undefined1 local_31 [49];
  
  this_00 = (response *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Content-MD5",(allocator *)this_00);
  set_header(this_00,in_RDI,(string *)0x39bc81);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  return;
}

Assistant:

void response::content_md5(std::string const &s) { set_header("Content-MD5",s); }